

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O1

vector<short,_std::allocator<short>_> *
cppqc::shrinkIntegral<short>(vector<short,_std::allocator<short>_> *__return_storage_ptr__,short x)

{
  iterator iVar1;
  short sVar2;
  undefined8 in_RAX;
  ulong uVar3;
  undefined8 uStack_28;
  
  uVar3 = (ulong)(ushort)x;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_28 = in_RAX;
  if (x < 0) {
    uStack_28._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_28._0_4_ = (undefined4)in_RAX;
    uStack_28._0_6_ = CONCAT24(-x,(undefined4)uStack_28);
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                (__return_storage_ptr__,iVar1,(short *)((long)&uStack_28 + 4));
    }
    else {
      *iVar1._M_current = -x;
      (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  if (x != 0) {
    do {
      sVar2 = (short)uVar3;
      uStack_28._0_4_ = CONCAT22(x - sVar2,(undefined2)uStack_28);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                  (__return_storage_ptr__,iVar1,(short *)((long)&uStack_28 + 2));
      }
      else {
        *iVar1._M_current = x - sVar2;
        (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar3 = (ulong)((uint)(int)(short)((short)((uVar3 & 0xffff) >> 0xf) + sVar2) >> 1);
    } while (2 < (ushort)(sVar2 + 1U));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}